

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O1

bool __thiscall
wasm::analysis::Flat<unsigned_int>::join(Flat<unsigned_int> *this,Element *joinee,Element *joiner)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  
  bVar1 = *(__index_type *)
           ((long)&(joinee->
                   super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   ).
                   super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
           + 4);
  uVar4 = 2;
  bVar2 = *(__index_type *)
           ((long)&(joiner->
                   super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   ).
                   super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                   .
                   super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
           + 4);
  if (((bVar2 <= bVar1) && (uVar4 = 3, bVar1 <= bVar2)) &&
     ((bVar1 != 1 ||
      (uVar4 = 0,
      *(int *)&(joinee->
               super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               ).
               super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               .
               super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               .
               super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               .
               super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               .
               super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
               .
               super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
      == *(int *)&(joiner->
                  super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  ).
                  super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  .
                  super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  .
                  super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  .
                  super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  .
                  super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  .
                  super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
      )))) {
    uVar4 = 1;
  }
  uVar3 = (*(code *)((long)&DAT_0026f1b0 + (long)(int)(&DAT_0026f1b0)[uVar4]))();
  return (bool)uVar3;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    switch (compare(joinee, joiner)) {
      case LESS:
        joinee = joiner;
        return true;
      case NO_RELATION:
        joinee = Element{Top{}};
        return true;
      case GREATER:
      case EQUAL:
        return false;
    }
    WASM_UNREACHABLE("unexpected comparison result");
  }